

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall
clipp::detail::
formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::wrap_hard(formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,int times)

{
  ostream *poVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  allocator local_39;
  string local_38 [36];
  int local_14;
  formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pfStack_10;
  int times_local;
  formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if (0 < times) {
    local_14 = times;
    pfStack_10 = this;
    iVar3 = paragraph_spacing(this);
    if (0 < iVar3) {
      iVar3 = paragraph_lines(this);
      iVar4 = min_paragraph_lines_for_spacing(this);
      if (iVar4 <= iVar3) {
        local_14 = paragraph_spacing(this);
        local_14 = local_14 + 1;
      }
    }
    if (local_14 < 2) {
      std::operator<<((ostream *)this->os_,'\n');
    }
    else {
      poVar1 = (ostream *)this->os_;
      uVar5 = (ulong)local_14;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,uVar5,'\n',&local_39);
      std::operator<<(poVar1,local_38);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      this->curBlankLines_ = local_14 + -1 + this->curBlankLines_;
    }
    bVar2 = at_begin_of_line(this);
    if (bVar2) {
      this->curBlankLines_ = this->curBlankLines_ + 1;
    }
    this->curCol_ = 0;
    this->curParagraphLines_ = 1;
  }
  return;
}

Assistant:

void wrap_hard(int times = 1) {
        if(times < 1) return;

        if(paragraph_spacing() > 0 &&
           paragraph_lines() >= min_paragraph_lines_for_spacing())
        {
            times = paragraph_spacing() + 1;
        }

        if(times > 1) {
            os_ << string_type(size_type(times), '\n');
            curBlankLines_ += times - 1;
        } else {
            os_ << '\n';
        }
        if(at_begin_of_line()) {
            ++curBlankLines_;
        }
        curCol_ = 0;
        curParagraphLines_ = 1;
    }